

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::OrderedPortConnectionSyntax::setChild
          (OrderedPortConnectionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffc8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *this_00;
  PropertyExprSyntax *local_20;
  not_null<slang::syntax::PropertyExprSyntax_*> local_18 [3];
  
  this_00 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&stack0x00000008;
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x1f1f9a);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>(pSVar1);
    SyntaxList<slang::syntax::AttributeInstanceSyntax>::operator=(this_00,in_stack_ffffffffffffffc8)
    ;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x1f1fbf);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_20 = (PropertyExprSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x1f1fcf);
      local_20 = SyntaxNode::as<slang::syntax::PropertyExprSyntax>(pSVar1);
    }
    not_null<slang::syntax::PropertyExprSyntax_*>::not_null<slang::syntax::PropertyExprSyntax_*>
              (local_18,&local_20);
    *(PropertyExprSyntax **)(in_RDI + 0x50) = local_18[0].ptr;
  }
  return;
}

Assistant:

void OrderedPortConnectionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: expr = child.node() ? &child.node()->as<PropertyExprSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}